

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  Resources *this_00;
  RefData<vk::Handle<(vk::HandleType)7>_> data;
  allocator<char> local_f9;
  string local_f8;
  Move<vk::Handle<(vk::HandleType)7>_> local_c8;
  RefData<vk::Handle<(vk::HandleType)7>_> local_a8;
  undefined1 local_88 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> obj;
  undefined1 local_60 [7];
  Resources res;
  Environment env;
  Context *context_local;
  Parameters params_local;
  
  params_local.size._0_4_ = (undefined4)params.size;
  context_local = context;
  params_local._8_8_ = __return_storage_ptr__;
  Environment::Environment((Environment *)local_60,(Context *)this,1);
  this_00 = (Resources *)
            ((long)&obj.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator + 7
            );
  DeviceMemory::Resources::Resources(this_00,(Environment *)local_60,(Parameters *)&context_local);
  DeviceMemory::create(&local_c8,(Environment *)local_60,this_00,(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data.object.m_internal = local_a8.object.m_internal;
  data.deleter.m_device = local_a8.deleter.m_device;
  data.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_88,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Ok",&local_f9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}